

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.cpp
# Opt level: O0

String * __thiscall CommandLine::describeOptions(String *__return_storage_ptr__,CommandLine *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  String *pSVar5;
  CommandLineOption **ppCVar6;
  reference ppCVar7;
  String local_330;
  undefined1 local_309;
  String local_308;
  undefined1 local_2e8 [8];
  String extradata;
  CommandLineOption *option_1;
  ConstIterator __end1_2;
  ConstIterator __begin1_2;
  List<CommandLineOption_*> *__range1_2;
  StringList extralines;
  int local_204;
  int local_200;
  int i;
  reference local_1f8;
  String *line_1;
  Iterator __end1_1;
  Iterator __begin1_1;
  StringList *__range1_1;
  undefined1 local_1a0 [4];
  int maxlength;
  undefined1 local_180 [8];
  String description;
  allocator<char> local_13c;
  undefined1 local_13b;
  char local_13a;
  undefined1 local_139;
  undefined1 *local_138;
  undefined8 local_130;
  string local_128 [32];
  String local_108;
  undefined1 local_e8 [8];
  String line;
  CommandLineOption *option;
  ConstIterator __end1;
  undefined1 local_90 [8];
  ConstIterator __begin1;
  List<CommandLineOption_*> *__range1;
  StringList lines;
  CommandLine *this_local;
  String *result;
  
  lines.super_List<String>._deque.super__Deque_base<String,_std::allocator<String>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)this;
  StringList::StringList((StringList *)&__range1);
  __begin1._M_node = (_Map_pointer)this;
  List<CommandLineOption_*>::begin((ConstIterator *)local_90,&this->_options);
  List<CommandLineOption_*>::end
            ((ConstIterator *)&option,(List<CommandLineOption_*> *)__begin1._M_node);
  while (bVar1 = std::operator!=((_Self *)local_90,(_Self *)&option), bVar1) {
    ppCVar7 = std::
              _Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
              ::operator*((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
                           *)local_90);
    line._24_8_ = *ppCVar7;
    String::String((String *)local_e8,"  ");
    cVar2 = CommandLineOption::shortform((CommandLineOption *)line._24_8_);
    if (cVar2 == '\0') {
      String::operator+=((String *)local_e8,"  ");
    }
    else {
      local_13b = 0x2d;
      local_13a = CommandLineOption::shortform((CommandLineOption *)line._24_8_);
      local_139 = 0;
      local_138 = &local_13b;
      local_130 = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,local_138,local_130,&local_13c);
      String::String(&local_108,(string *)local_128);
      String::operator+=((String *)local_e8,&local_108);
      String::~String(&local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator(&local_13c);
    }
    String::operator+=((String *)local_e8,"  ");
    pSVar5 = CommandLineOption::longform((CommandLineOption *)line._24_8_);
    bVar1 = String::isEmpty(pSVar5);
    if (!bVar1) {
      pSVar5 = CommandLineOption::longform((CommandLineOption *)line._24_8_);
      ::operator+((String *)&description.field_0x18,"--",pSVar5);
      String::operator+=((String *)local_e8,(String *)&description.field_0x18);
      String::~String((String *)&description.field_0x18);
      (**(code **)(*(long *)line._24_8_ + 0x18))(local_180);
      bVar1 = String::isEmpty((String *)local_180);
      if (!bVar1) {
        ::operator+((String *)local_1a0,"=",(String *)local_180);
        String::operator+=((String *)local_e8,(String *)local_1a0);
        String::~String((String *)local_1a0);
      }
      String::~String((String *)local_180);
    }
    List<String>::operator<<((List<String> *)&__range1,(String *)local_e8);
    String::~String((String *)local_e8);
    std::
    _Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>::
    operator++((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
                *)local_90);
  }
  __range1_1._4_4_ = 0;
  List<String>::begin((Iterator *)&__end1_1._M_node,(List<String> *)&__range1);
  List<String>::end((Iterator *)&line_1,(List<String> *)&__range1);
  while (bVar1 = std::operator!=((_Self *)&__end1_1._M_node,(_Self *)&line_1), bVar1) {
    local_1f8 = std::_Deque_iterator<String,_String_&,_String_*>::operator*
                          ((_Deque_iterator<String,_String_&,_String_*> *)&__end1_1._M_node);
    iVar3 = String::length(local_1f8);
    __range1_1._4_4_ = max<int>(__range1_1._4_4_,iVar3);
    std::_Deque_iterator<String,_String_&,_String_*>::operator++
              ((_Deque_iterator<String,_String_&,_String_*> *)&__end1_1._M_node);
  }
  iVar3 = List<String>::size((List<String> *)&__range1);
  iVar4 = List<CommandLineOption_*>::size(&this->_options);
  if (iVar3 != iVar4) {
    i = List<String>::size((List<String> *)&__range1);
    local_200 = List<CommandLineOption_*>::size(&this->_options);
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/commandline.cpp:176: lines.size() (%1) does not equal _options.size() (%2)"
                   ,&i,&local_200);
  }
  for (local_204 = 0; iVar3 = List<String>::size((List<String> *)&__range1), local_204 < iVar3;
      local_204 = local_204 + 1) {
    while( true ) {
      pSVar5 = List<String>::operator[]((List<String> *)&__range1,local_204);
      iVar3 = String::length(pSVar5);
      if (__range1_1._4_4_ + 2 <= iVar3) break;
      pSVar5 = List<String>::operator[]((List<String> *)&__range1,local_204);
      String::operator+=(pSVar5," ");
    }
    ppCVar6 = List<CommandLineOption_*>::operator[](&this->_options,local_204);
    pSVar5 = CommandLineOption::description(*ppCVar6);
    String::String((String *)
                   &extralines.super_List<String>._deque.
                    super__Deque_base<String,_std::allocator<String>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,pSVar5);
    pSVar5 = List<String>::operator[]((List<String> *)&__range1,local_204);
    String::operator+=(pSVar5,(String *)
                              &extralines.super_List<String>._deque.
                               super__Deque_base<String,_std::allocator<String>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_node);
    String::~String((String *)
                    &extralines.super_List<String>._deque.
                     super__Deque_base<String,_std::allocator<String>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node);
  }
  StringList::StringList((StringList *)&__range1_2);
  List<CommandLineOption_*>::begin((ConstIterator *)&__end1_2._M_node,&this->_options);
  List<CommandLineOption_*>::end((ConstIterator *)&option_1,&this->_options);
  while (bVar1 = std::operator!=((_Self *)&__end1_2._M_node,(_Self *)&option_1), bVar1) {
    ppCVar7 = std::
              _Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
              ::operator*((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
                           *)&__end1_2._M_node);
    extradata._24_8_ = *ppCVar7;
    (*((CommandLineOption *)extradata._24_8_)->_vptr_CommandLineOption[4])(local_2e8);
    bVar1 = String::isEmpty((String *)local_2e8);
    if (!bVar1) {
      bVar1 = List<String>::isEmpty((List<String> *)&__range1_2);
      if (bVar1) {
        String::String(&local_308,"");
        List<String>::operator<<((List<String> *)&__range1_2,&local_308);
        String::~String(&local_308);
      }
      List<String>::operator<<((List<String> *)&__range1_2,(String *)local_2e8);
    }
    String::~String((String *)local_2e8);
    std::
    _Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>::
    operator++((_Deque_iterator<CommandLineOption_*,_CommandLineOption_*const_&,_CommandLineOption_*const_*>
                *)&__end1_2._M_node);
  }
  List<String>::merge((List<String> *)&__range1,(List<String> *)&__range1_2);
  local_309 = 0;
  String::String(&local_330,"\n");
  StringList::join(__return_storage_ptr__,(StringList *)&__range1,&local_330);
  String::~String(&local_330);
  local_309 = 1;
  StringList::~StringList((StringList *)&__range1_2);
  StringList::~StringList((StringList *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

String CommandLine::describeOptions() const
{
	StringList lines;

	for (CommandLineOption* option : _options)
	{
		String line ("  ");

		if (option->shortform() != '\0')
			line += String ({'-', option->shortform(), '\0'});
		else
			line += "  ";

		line += "  ";

		if (not option->longform().isEmpty())
		{
			line += "--" + option->longform();
			String description (option->describeArgument());

			if (not description.isEmpty())
				line += "=" + description;
		}

		lines << line;
	}

	int maxlength (0);

	for (String& line : lines)
		maxlength = max (maxlength, line.length());

	maxlength += 2;
	ASSERT_EQ (lines.size(), _options.size());

	for (int i = 0; i < lines.size(); ++i)
	{
		while (lines[i].length() < maxlength)
			lines[i] += " ";

		lines[i] += _options[i]->description();
	}

	StringList extralines;

	for (CommandLineOption* option : _options)
	{
		String extradata = option->describeExtra();

		if (not extradata.isEmpty())
		{
			if (extralines.isEmpty())
				extralines << "";

			extralines << extradata;
		}
	}

	lines.merge (extralines);
	String result (lines.join ("\n"));
	return result;
}